

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O3

LLVMValueRef CompileArgument(LlvmCompilationContext *ctx,TypeBase *argumentType,ExprBase *value)

{
  TypeBase *targetType;
  ExpressionContext *pEVar1;
  LLVMValueRef pLVar2;
  long lVar3;
  TypeBase *valueType;
  
  pLVar2 = CompileLlvm(ctx,value);
  targetType = value->type;
  pEVar1 = ctx->ctx;
  lVar3 = 0x89d8;
  if (((pEVar1->typeBool != targetType) && (pEVar1->typeChar != targetType)) &&
     (pEVar1->typeShort != targetType)) {
    valueType = targetType;
    if (pEVar1->typeFloat != targetType) goto LAB_00191b95;
    lVar3 = 0x89f0;
  }
  valueType = *(TypeBase **)((long)(pEVar1->uniqueDependencies).little + lVar3 + -0x30);
LAB_00191b95:
  pLVar2 = ConvertToDataType(ctx,pLVar2,valueType,targetType);
  return pLVar2;
}

Assistant:

LLVMValueRef CompileArgument(LlvmCompilationContext& ctx, TypeBase* argumentType, ExprBase* value)
{
	LLVMValueRef argument = CompileLlvm(ctx, value);

	argument = ConvertToDataType(ctx, argument, GetStackType(ctx, value->type), value->type);

	return CompileArgument(ctx, argumentType, argument);
}